

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

int __thiscall QAccessibleTable::columnCount(QAccessibleTable *this)

{
  QAbstractItemModel *pQVar1;
  int *piVar2;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  int modelColumnCount;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_30;
  int local_2c;
  undefined1 local_28 [28];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  view((QAccessibleTable *)0x7f33aa);
  pQVar1 = QAbstractItemView::model(in_RDI);
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_30 = 0;
  }
  else {
    QAbstractItemView::rootIndex
              ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_30 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_28);
    local_c = local_30;
    if (*(int *)&in_RDI[1].super_QAbstractScrollArea.super_QFrame.super_QWidget == 0x21) {
      local_2c = 1;
      piVar2 = qMin<int>(&local_2c,&local_c);
      local_30 = *piVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

int QAccessibleTable::columnCount() const
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return 0;
    const int modelColumnCount = theModel->columnCount(theView->rootIndex());
    return m_role == QAccessible::List ? qMin(1, modelColumnCount) : modelColumnCount;
}